

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
* kratos::get_state_color
            (map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
             *__return_storage_ptr__,
            vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *states)

{
  _Rb_tree_header *p_Var1;
  pointer ppFVar2;
  Color CVar3;
  iterator iVar4;
  mapped_type *__args_1;
  FSMState **state_1;
  pointer ppFVar5;
  FSMState **state;
  result_type_conflict rVar6;
  double h;
  undefined1 local_1410 [8];
  mt19937 gen;
  map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
  state_color;
  uniform_real_distribution<double> dis;
  FSM *local_40;
  FSM *fsm;
  Color color;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  state_color._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&state_color;
  state_color._M_t._M_impl._0_4_ = 0;
  state_color._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  state_color._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  state_color._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  state_color._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       state_color._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)local_1410,1);
  state_color._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppFVar2 = (states->super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar5 = (states->
                 super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppFVar5 != ppFVar2; ppFVar5 = ppFVar5 + 1
      ) {
    local_40 = (*ppFVar5)->parent_;
    iVar4 = std::
            _Rb_tree<const_kratos::FSM_*,_std::pair<const_kratos::FSM_*const,_kratos::color::Color>,_std::_Select1st<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
            ::find((_Rb_tree<const_kratos::FSM_*,_std::pair<const_kratos::FSM_*const,_kratos::color::Color>,_std::_Select1st<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
                    *)&gen._M_p,&local_40);
    if (iVar4._M_node == (_Base_ptr)&state_color) {
      rVar6 = std::uniform_real_distribution<double>::operator()
                        ((uniform_real_distribution<double> *)
                         &state_color._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_1410);
      h = fmod(rVar6 + 0.618033988749895,1.0);
      CVar3 = kratos::color::hsv_to_rgb(h,0.5,0.95);
      fsm._4_2_ = CVar3._0_2_;
      fsm._6_1_ = CVar3.B;
      std::
      _Rb_tree<kratos::FSM_const*,std::pair<kratos::FSM_const*const,kratos::color::Color>,std::_Select1st<std::pair<kratos::FSM_const*const,kratos::color::Color>>,std::less<kratos::FSM_const*>,std::allocator<std::pair<kratos::FSM_const*const,kratos::color::Color>>>
      ::_M_emplace_unique<kratos::FSM_const*&,kratos::color::Color&>
                ((_Rb_tree<kratos::FSM_const*,std::pair<kratos::FSM_const*const,kratos::color::Color>,std::_Select1st<std::pair<kratos::FSM_const*const,kratos::color::Color>>,std::less<kratos::FSM_const*>,std::allocator<std::pair<kratos::FSM_const*const,kratos::color::Color>>>
                  *)&gen._M_p,&local_40,(Color *)((long)&fsm + 4));
    }
  }
  ppFVar2 = (states->super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar5 = (states->
                 super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppFVar5 != ppFVar2; ppFVar5 = ppFVar5 + 1
      ) {
    local_40 = (*ppFVar5)->parent_;
    __args_1 = std::
               map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
               ::at((map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
                     *)&gen._M_p,&local_40);
    std::
    _Rb_tree<kratos::FSMState*,std::pair<kratos::FSMState*const,kratos::color::Color>,std::_Select1st<std::pair<kratos::FSMState*const,kratos::color::Color>>,std::less<kratos::FSMState*>,std::allocator<std::pair<kratos::FSMState*const,kratos::color::Color>>>
    ::_M_emplace_unique<kratos::FSMState*const&,kratos::color::Color&>
              ((_Rb_tree<kratos::FSMState*,std::pair<kratos::FSMState*const,kratos::color::Color>,std::_Select1st<std::pair<kratos::FSMState*const,kratos::color::Color>>,std::less<kratos::FSMState*>,std::allocator<std::pair<kratos::FSMState*const,kratos::color::Color>>>
                *)__return_storage_ptr__,ppFVar5,__args_1);
  }
  std::
  _Rb_tree<const_kratos::FSM_*,_std::pair<const_kratos::FSM_*const,_kratos::color::Color>,_std::_Select1st<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
  ::~_Rb_tree((_Rb_tree<const_kratos::FSM_*,_std::pair<const_kratos::FSM_*const,_kratos::color::Color>,_std::_Select1st<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
               *)&gen._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::map<FSMState*, color::Color> get_state_color(const std::vector<FSMState*>& states) {
    std::map<FSMState*, color::Color> result = {};
    std::map<const FSM*, color::Color> state_color;
    // set seed to 0
    std::mt19937 gen(1);  // NOLINT
    std::uniform_real_distribution<double> dis(0, 1.0);
    for (auto const& state : states) {
        auto const* fsm = state->parent();
        if (state_color.find(fsm) == state_color.end()) {
            // get a new color
            double h = dis(gen);
            // use golden ratio
            // https://martin.ankerl.com/2009/12/09/how-to-create-random-colors-programmatically/
            h += 0.618033988749895;
            h = std::fmod(h, 1.0);
            auto color = color::hsv_to_rgb(h, 0.5, 0.95);
            state_color.emplace(fsm, color);
        }
    }

    // second pass the assign colors
    for (const auto& state : states) {
        const auto* fsm = state->parent();
        result.emplace(state, state_color.at(fsm));
    }

    return result;
}